

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_ae8::ndiPSTATHelper(ndicapi *pol,char *command,char *commandReply)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  char (*pacVar5) [32];
  long lVar6;
  long lVar7;
  char (*pacVar8) [2];
  char (*pacVar9) [20];
  char (*pacVar10) [8];
  char *pcVar11;
  char (*pacVar12) [2];
  
  uVar3 = 1;
  if (command[5] == ' ') {
    cVar2 = command[6];
  }
  else {
    if (command[5] != ':') goto LAB_00108a49;
    cVar2 = command[10];
  }
  if (cVar2 != '\r') {
    uVar3 = ndiHexToUnsignedLong(command + 6,4);
  }
LAB_00108a49:
  pacVar5 = pol->PstatBasic;
  lVar7 = 0;
  pacVar8 = pol->PstatMarkerType;
  pacVar9 = pol->PstatPartNumber;
  pacVar10 = pol->PstatTesting;
  pacVar12 = pol->PstatAccessories;
  do {
    if ((uVar3 & 1) != 0) {
      lVar4 = 0;
      do {
        if (commandReply[lVar4] < ' ') {
          (*pacVar5)[lVar4] = '\0';
          break;
        }
        (*pacVar5)[lVar4] = commandReply[lVar4];
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 0x20);
      commandReply = commandReply + lVar4;
    }
    if ((uVar3 & 2) != 0) {
      pol->PstatTesting[lVar7][0] = '\0';
      lVar4 = 0;
      do {
        if (commandReply[lVar4] < ' ') break;
        (*pacVar10)[lVar4] = commandReply[lVar4];
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 8);
      commandReply = commandReply + lVar4;
    }
    if ((uVar3 & 4) != 0) {
      pol->PstatPartNumber[lVar7][0] = '\0';
      lVar4 = 0;
      do {
        if (commandReply[lVar4] < ' ') break;
        (*pacVar9)[lVar4] = commandReply[lVar4];
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 0x14);
      commandReply = commandReply + lVar4;
    }
    if ((uVar3 & 8) != 0) {
      pol->PstatAccessories[lVar7][0] = '\0';
      lVar4 = 0;
      do {
        if (commandReply[lVar4] < ' ') break;
        (*pacVar12)[lVar4] = commandReply[lVar4];
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 == 1);
      commandReply = commandReply + lVar4;
    }
    if ((uVar3 & 0x10) != 0) {
      pol->PstatMarkerType[lVar7][0] = '\0';
      lVar4 = 0;
      do {
        if (commandReply[lVar4] < ' ') break;
        (*pacVar8)[lVar4] = commandReply[lVar4];
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 == 1);
      commandReply = commandReply + lVar4;
    }
    pcVar11 = commandReply + -1;
    do {
      cVar2 = pcVar11[1];
      pcVar11 = pcVar11 + 1;
    } while ('\x1f' < cVar2);
    commandReply = pcVar11 + (cVar2 == '\n');
    lVar7 = lVar7 + 1;
    pacVar5 = pacVar5 + 1;
    pacVar10 = pacVar10 + 1;
    pacVar9 = pacVar9 + 1;
    pacVar12 = pacVar12 + 1;
    pacVar8 = pacVar8 + 1;
  } while (lVar7 != 3);
  if ((short)uVar3 < 0) {
    pcVar11 = pcVar11 + (cVar2 == '\n');
    lVar7 = 9;
    if (((uint)uVar3 >> 0xd & 1) == 0) {
      lVar7 = 3;
    }
    lVar4 = 0;
    pacVar8 = pol->PstatPassiveMarkerType;
    pacVar10 = pol->PstatPassiveTesting;
    pacVar5 = pol->PstatPassiveBasic;
    pacVar12 = pol->PstatPassiveAccessories;
    pacVar9 = pol->PstatPassivePartNumber;
    do {
      if ((uVar3 & 1) != 0) {
        pol->PstatPassiveBasic[lVar4][0] = '\0';
        lVar6 = 0;
        do {
          if (pcVar11[lVar6] < ' ') {
            (*pacVar5)[lVar6] = '\0';
            break;
          }
          (*pacVar5)[lVar6] = pcVar11[lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 0x20);
        pcVar11 = pcVar11 + lVar6;
      }
      if ((uVar3 & 2) != 0) {
        pol->PstatPassiveTesting[lVar4][0] = '\0';
        lVar6 = 0;
        do {
          if (pcVar11[lVar6] < ' ') break;
          (*pacVar10)[lVar6] = pcVar11[lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 8);
        pcVar11 = pcVar11 + lVar6;
      }
      if ((uVar3 & 4) != 0) {
        pol->PstatPassivePartNumber[lVar4][0] = '\0';
        lVar6 = 0;
        do {
          if (pcVar11[lVar6] < ' ') break;
          (*pacVar9)[lVar6] = pcVar11[lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 0x14);
        pcVar11 = pcVar11 + lVar6;
      }
      if ((uVar3 & 8) != 0) {
        pol->PstatPassiveAccessories[lVar4][0] = '\0';
        lVar6 = 0;
        do {
          if (pcVar11[lVar6] < ' ') break;
          (*pacVar12)[lVar6] = pcVar11[lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 == 1);
        pcVar11 = pcVar11 + lVar6;
      }
      if ((uVar3 & 0x10) != 0) {
        pol->PstatPassiveMarkerType[lVar4][0] = '\0';
        lVar6 = 0;
        do {
          if (pcVar11[lVar6] < ' ') break;
          (*pacVar8)[lVar6] = pcVar11[lVar6];
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 == 1);
        pcVar11 = pcVar11 + lVar6;
      }
      pcVar11 = pcVar11 + -1;
      do {
        pcVar1 = pcVar11 + 1;
        pcVar11 = pcVar11 + 1;
      } while ('\x1f' < *pcVar1);
      pcVar11 = pcVar11 + (*pcVar1 == '\n');
      lVar4 = lVar4 + 1;
      pacVar5 = pacVar5 + 1;
      pacVar10 = pacVar10 + 1;
      pacVar9 = pacVar9 + 1;
      pacVar12 = pacVar12 + 1;
      pacVar8 = pacVar8 + 1;
    } while (lVar4 != lVar7);
  }
  return;
}

Assistant:

void ndiPSTATHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j;
    int passiveCount, activeCount;

    // if the PSTAT command had a reply mode, read it
    if ((command[5] == ':' && command[10] != '\r') || (command[5] == ' ' && command[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[6], 4);
    }

    // always three active ports
    activeCount = 3;

    // information for each port is separated by a newline
    for (i = 0; i < activeCount; i++)
    {
      // basic tool information and port status
      if (mode & NDI_BASIC)
      {
        writePointer = pol->PstatBasic[i];
        for (j = 0; j < 32 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // terminate if UNOCCUPIED
        if (j < 32)
        {
          *writePointer = '\0';
        }
      }

      // current testing
      if (mode & NDI_TESTING)
      {
        writePointer = pol->PstatTesting[i];
        *writePointer = '\0';
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // part number
      if (mode & NDI_PART_NUMBER)
      {
        writePointer = pol->PstatPartNumber[i];
        *writePointer = '\0';
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // accessories
      if (mode & NDI_ACCESSORIES)
      {
        writePointer = pol->PstatAccessories[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // marker type
      if (mode & NDI_MARKER_TYPE)
      {
        writePointer = pol->PstatMarkerType[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // skip any other information that might be present
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // if there is no passive information, stop here
    if (!(mode & NDI_PASSIVE))
    {
      return;
    }

    // in case there are 9 passive tools instead of just 3
    passiveCount = 3;
    if (mode & NDI_PASSIVE_EXTRA)
    {
      passiveCount = 9;
    }

    // information for each port is separated by a newline
    for (i = 0; i < passiveCount; i++)
    {
      // basic tool information and port status
      if (mode & NDI_BASIC)
      {
        writePointer = pol->PstatPassiveBasic[i];
        *writePointer = '\0';
        for (j = 0; j < 32 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // terminate if UNOCCUPIED
        if (j < 32)
        {
          *writePointer = '\0';
        }
      }

      // current testing
      if (mode & NDI_TESTING)
      {
        writePointer = pol->PstatPassiveTesting[i];
        *writePointer = '\0';
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // part number
      if (mode & NDI_PART_NUMBER)
      {
        writePointer = pol->PstatPassivePartNumber[i];
        *writePointer = '\0';
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // accessories
      if (mode & NDI_ACCESSORIES)
      {
        writePointer = pol->PstatPassiveAccessories[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // marker type
      if (mode & NDI_MARKER_TYPE)
      {
        writePointer = pol->PstatPassiveMarkerType[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // skip any other information that might be present
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }
  }